

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGCompile(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict def)

{
  int iVar1;
  xmlAutomataPtr pxVar2;
  xmlAutomataStatePtr pxVar3;
  xmlAutomataStatePtr pxVar4;
  _xmlRegexp *p_Var5;
  uint uVar6;
  xmlAutomataPtr pxVar7;
  char *str1;
  xmlRelaxNGDefinePtr_conflict pxVar8;
  xmlRelaxNGDefinePtr pxVar9;
  
LAB_00189129:
  if (def == (xmlRelaxNGDefinePtr_conflict)0x0) {
    return -1;
  }
  uVar6 = def->type + XML_RELAXNG_NOT_ALLOWED;
  switch((ulong)uVar6) {
  case 0:
    goto switchD_0018914d_caseD_0;
  case 1:
    pxVar7 = ctxt->am;
    pxVar4 = ctxt->state;
    goto LAB_0018946b;
  case 2:
  case 3:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0x14:
    if (uVar6 < 0x16) {
      str1 = &DAT_001df9f0 + *(int *)(&DAT_001df9f0 + (ulong)uVar6 * 4);
    }
    else {
      str1 = "unknown";
    }
    xmlRngPErr(ctxt,(xmlNodePtr)0x0,1,"RNG internal error trying to compile %s\n",(xmlChar *)str1,
               (xmlChar *)0x0);
    return 0;
  case 4:
    pxVar4 = xmlAutomataNewEpsilon(ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0);
    ctxt->state = pxVar4;
    xmlRelaxNGCompile(ctxt,def->content);
    xmlAutomataNewTransition(ctxt->am,ctxt->state,ctxt->state,(xmlChar *)"#text",(void *)0x0);
    goto LAB_00189461;
  case 5:
    if ((ctxt->am != (xmlAutomataPtr)0x0) && (def->name != (xmlChar *)0x0)) {
      pxVar4 = xmlAutomataNewTransition2
                         (ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0,def->name,def->ns,def);
      ctxt->state = pxVar4;
    }
    if (((def->dflags & 0x40) == 0) || (def->depth == -0x19)) {
      pxVar7 = ctxt->am;
      iVar1 = xmlRelaxNGTryCompile(ctxt,def);
      ctxt->am = pxVar7;
      return iVar1;
    }
    pxVar7 = ctxt->am;
    pxVar4 = ctxt->state;
    def->depth = -0x19;
    pxVar8 = def->content;
    pxVar2 = xmlNewAutomata();
    ctxt->am = pxVar2;
    if (pxVar2 == (xmlAutomataPtr)0x0) {
      return -1;
    }
    xmlAutomataSetFlags(pxVar2,1);
    pxVar3 = xmlAutomataGetInitState(ctxt->am);
    ctxt->state = pxVar3;
    for (; pxVar8 != (xmlRelaxNGDefinePtr_conflict)0x0; pxVar8 = pxVar8->next) {
      xmlRelaxNGCompile(ctxt,pxVar8);
    }
    xmlAutomataSetFinalState(ctxt->am,ctxt->state);
    p_Var5 = xmlAutomataCompile(ctxt->am);
    def->contModel = p_Var5;
    iVar1 = xmlRegexpIsDeterminist(p_Var5);
    if (iVar1 == 0) {
      xmlRegFreeRegexp(def->contModel);
      def->contModel = (xmlRegexpPtr)0x0;
    }
    break;
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x13:
    pxVar9 = def->content;
    while( true ) {
      if (pxVar9 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return 0;
      }
      iVar1 = xmlRelaxNGCompile(ctxt,pxVar9);
      if (iVar1 != 0) break;
      pxVar9 = pxVar9->next;
    }
    return iVar1;
  case 0xf:
    pxVar4 = ctxt->state;
    for (pxVar9 = def->content; pxVar9 != (xmlRelaxNGDefinePtr_conflict)0x0; pxVar9 = pxVar9->next)
    {
      xmlRelaxNGCompile(ctxt,pxVar9);
    }
    xmlAutomataNewEpsilon(ctxt->am,pxVar4,ctxt->state);
    return 0;
  case 0x10:
    pxVar4 = xmlAutomataNewEpsilon(ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0);
    ctxt->state = pxVar4;
    for (pxVar9 = def->content; pxVar9 != (xmlRelaxNGDefinePtr_conflict)0x0; pxVar9 = pxVar9->next)
    {
      xmlRelaxNGCompile(ctxt,pxVar9);
    }
    xmlAutomataNewEpsilon(ctxt->am,ctxt->state,pxVar4);
LAB_00189461:
    pxVar7 = ctxt->am;
    goto LAB_0018946b;
  case 0x11:
    for (pxVar9 = def->content; pxVar9 != (xmlRelaxNGDefinePtr_conflict)0x0; pxVar9 = pxVar9->next)
    {
      xmlRelaxNGCompile(ctxt,pxVar9);
    }
    pxVar4 = ctxt->state;
    for (pxVar9 = def->content; pxVar9 != (xmlRelaxNGDefinePtr_conflict)0x0; pxVar9 = pxVar9->next)
    {
      xmlRelaxNGCompile(ctxt,pxVar9);
    }
    xmlAutomataNewEpsilon(ctxt->am,ctxt->state,pxVar4);
    pxVar7 = ctxt->am;
LAB_0018946b:
    pxVar4 = xmlAutomataNewEpsilon(pxVar7,pxVar4,(xmlAutomataStatePtr)0x0);
    ctxt->state = pxVar4;
    return 0;
  case 0x12:
    pxVar8 = def->content;
    if (pxVar8 == (xmlRelaxNGDefinePtr_conflict)0x0) {
      pxVar3 = (xmlAutomataStatePtr)0x0;
      goto LAB_00189481;
    }
    pxVar4 = ctxt->state;
    pxVar3 = (xmlAutomataStatePtr)0x0;
    goto LAB_00189235;
  case 0x15:
    iVar1 = xmlRelaxNGIsCompilable(def);
    if (iVar1 != 1) {
      return 0;
    }
    if (def->depth == -0x19) {
      return 0;
    }
    pxVar7 = ctxt->am;
    pxVar4 = ctxt->state;
    def->depth = -0x19;
    pxVar8 = def->content;
    pxVar2 = xmlNewAutomata();
    ctxt->am = pxVar2;
    if (pxVar2 == (xmlAutomataPtr)0x0) {
      return -1;
    }
    xmlAutomataSetFlags(pxVar2,1);
    pxVar3 = xmlAutomataGetInitState(ctxt->am);
    ctxt->state = pxVar3;
    for (; pxVar8 != (xmlRelaxNGDefinePtr_conflict)0x0; pxVar8 = pxVar8->next) {
      xmlRelaxNGCompile(ctxt,pxVar8);
    }
    xmlAutomataSetFinalState(ctxt->am,ctxt->state);
    iVar1 = xmlAutomataIsDeterminist(ctxt->am);
    if (iVar1 != 0) {
      p_Var5 = xmlAutomataCompile(ctxt->am);
      def->contModel = p_Var5;
    }
    break;
  default:
    goto LAB_0018958f;
  }
  xmlFreeAutomata(ctxt->am);
  ctxt->state = pxVar4;
  ctxt->am = pxVar7;
LAB_0018958f:
  return 0;
switchD_0018914d_caseD_0:
  def = def->content;
  goto LAB_00189129;
LAB_00189235:
  do {
    ctxt->state = pxVar4;
    iVar1 = xmlRelaxNGCompile(ctxt,pxVar8);
    if (iVar1 != 0) goto LAB_00189489;
    if (pxVar3 == (xmlAutomataStatePtr)0x0) {
      pxVar3 = ctxt->state;
    }
    else {
      xmlAutomataNewEpsilon(ctxt->am,ctxt->state,pxVar3);
    }
    pxVar8 = pxVar8->next;
  } while (pxVar8 != (xmlRelaxNGDefinePtr)0x0);
LAB_00189481:
  iVar1 = 0;
LAB_00189489:
  ctxt->state = pxVar3;
  return iVar1;
}

Assistant:

static int
xmlRelaxNGCompile(xmlRelaxNGParserCtxtPtr ctxt, xmlRelaxNGDefinePtr def)
{
    int ret = 0;
    xmlRelaxNGDefinePtr list;

    if ((ctxt == NULL) || (def == NULL))
        return (-1);

    switch (def->type) {
        case XML_RELAXNG_START:
            if ((xmlRelaxNGIsCompilable(def) == 1) && (def->depth != -25)) {
                xmlAutomataPtr oldam = ctxt->am;
                xmlAutomataStatePtr oldstate = ctxt->state;

                def->depth = -25;

                list = def->content;
                ctxt->am = xmlNewAutomata();
                if (ctxt->am == NULL)
                    return (-1);

                /*
                 * assume identical strings but not same pointer are different
                 * atoms, needed for non-determinism detection
                 * That way if 2 elements with the same name are in a choice
                 * branch the automata is found non-deterministic and
                 * we fallback to the normal validation which does the right
                 * thing of exploring both choices.
                 */
                xmlAutomataSetFlags(ctxt->am, 1);

                ctxt->state = xmlAutomataGetInitState(ctxt->am);
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                xmlAutomataSetFinalState(ctxt->am, ctxt->state);
                if (xmlAutomataIsDeterminist(ctxt->am))
                    def->contModel = xmlAutomataCompile(ctxt->am);

                xmlFreeAutomata(ctxt->am);
                ctxt->state = oldstate;
                ctxt->am = oldam;
            }
            break;
        case XML_RELAXNG_ELEMENT:
            if ((ctxt->am != NULL) && (def->name != NULL)) {
                ctxt->state = xmlAutomataNewTransition2(ctxt->am,
                                                        ctxt->state, NULL,
                                                        def->name, def->ns,
                                                        def);
            }
            if ((def->dflags & IS_COMPILABLE) && (def->depth != -25)) {
                xmlAutomataPtr oldam = ctxt->am;
                xmlAutomataStatePtr oldstate = ctxt->state;

                def->depth = -25;

                list = def->content;
                ctxt->am = xmlNewAutomata();
                if (ctxt->am == NULL)
                    return (-1);
                xmlAutomataSetFlags(ctxt->am, 1);
                ctxt->state = xmlAutomataGetInitState(ctxt->am);
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                xmlAutomataSetFinalState(ctxt->am, ctxt->state);
                def->contModel = xmlAutomataCompile(ctxt->am);
                if (!xmlRegexpIsDeterminist(def->contModel)) {
                    /*
                     * we can only use the automata if it is determinist
                     */
                    xmlRegFreeRegexp(def->contModel);
                    def->contModel = NULL;
                }
                xmlFreeAutomata(ctxt->am);
                ctxt->state = oldstate;
                ctxt->am = oldam;
            } else {
                xmlAutomataPtr oldam = ctxt->am;

                /*
                 * we can't build the content model for this element content
                 * but it still might be possible to build it for some of its
                 * children, recurse.
                 */
                ret = xmlRelaxNGTryCompile(ctxt, def);
                ctxt->am = oldam;
            }
            break;
        case XML_RELAXNG_NOOP:
            ret = xmlRelaxNGCompile(ctxt, def->content);
            break;
        case XML_RELAXNG_OPTIONAL:{
                xmlAutomataStatePtr oldstate = ctxt->state;

                list = def->content;
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
                break;
            }
        case XML_RELAXNG_ZEROORMORE:{
                xmlAutomataStatePtr oldstate;

                ctxt->state =
                    xmlAutomataNewEpsilon(ctxt->am, ctxt->state, NULL);
                oldstate = ctxt->state;
                list = def->content;
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                xmlAutomataNewEpsilon(ctxt->am, ctxt->state, oldstate);
                ctxt->state =
                    xmlAutomataNewEpsilon(ctxt->am, oldstate, NULL);
                break;
            }
        case XML_RELAXNG_ONEORMORE:{
                xmlAutomataStatePtr oldstate;

                list = def->content;
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                oldstate = ctxt->state;
                list = def->content;
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                xmlAutomataNewEpsilon(ctxt->am, ctxt->state, oldstate);
                ctxt->state =
                    xmlAutomataNewEpsilon(ctxt->am, oldstate, NULL);
                break;
            }
        case XML_RELAXNG_CHOICE:{
                xmlAutomataStatePtr target = NULL;
                xmlAutomataStatePtr oldstate = ctxt->state;

                list = def->content;
                while (list != NULL) {
                    ctxt->state = oldstate;
                    ret = xmlRelaxNGCompile(ctxt, list);
                    if (ret != 0)
                        break;
                    if (target == NULL)
                        target = ctxt->state;
                    else {
                        xmlAutomataNewEpsilon(ctxt->am, ctxt->state,
                                              target);
                    }
                    list = list->next;
                }
                ctxt->state = target;

                break;
            }
        case XML_RELAXNG_REF:
        case XML_RELAXNG_EXTERNALREF:
        case XML_RELAXNG_PARENTREF:
        case XML_RELAXNG_GROUP:
        case XML_RELAXNG_DEF:
            list = def->content;
            while (list != NULL) {
                ret = xmlRelaxNGCompile(ctxt, list);
                if (ret != 0)
                    break;
                list = list->next;
            }
            break;
        case XML_RELAXNG_TEXT:{
                xmlAutomataStatePtr oldstate;

                ctxt->state =
                    xmlAutomataNewEpsilon(ctxt->am, ctxt->state, NULL);
                oldstate = ctxt->state;
                xmlRelaxNGCompile(ctxt, def->content);
                xmlAutomataNewTransition(ctxt->am, ctxt->state,
                                         ctxt->state, BAD_CAST "#text",
                                         NULL);
                ctxt->state =
                    xmlAutomataNewEpsilon(ctxt->am, oldstate, NULL);
                break;
            }
        case XML_RELAXNG_EMPTY:
            ctxt->state =
                xmlAutomataNewEpsilon(ctxt->am, ctxt->state, NULL);
            break;
        case XML_RELAXNG_EXCEPT:
        case XML_RELAXNG_ATTRIBUTE:
        case XML_RELAXNG_INTERLEAVE:
        case XML_RELAXNG_NOT_ALLOWED:
        case XML_RELAXNG_DATATYPE:
        case XML_RELAXNG_LIST:
        case XML_RELAXNG_PARAM:
        case XML_RELAXNG_VALUE:
            xmlRngPErr(ctxt, NULL, XML_ERR_INTERNAL_ERROR,
                       "RNG internal error trying to compile %s\n",
                       BAD_CAST xmlRelaxNGDefName(def), NULL);
            break;
    }
    return (ret);
}